

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O2

void __thiscall
DynLibrary::findSymbol<int(*)(JavaVM_**,void**,void*)>
          (DynLibrary *this,char *name,_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr **ptr)

{
  _func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *p_Var1;
  runtime_error *this_00;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  p_Var1 = (_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *)dlsym(this->module);
  *ptr = p_Var1;
  if (p_Var1 != (_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Symbol \'",&local_c1);
  std::operator+(&local_a0,&local_c0,name);
  std::operator+(&local_80,&local_a0,"\' not found in \'");
  std::operator+(&local_60,&local_80,&this->filename);
  std::operator+(&local_40,&local_60,"\'.");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void findSymbol(const char* name, T& ptr)
	{
#ifdef WIN32
		ptr = reinterpret_cast<T>(GetProcAddress(module, name));
#else
		ptr = reinterpret_cast<T>(dlsym(module, name));
#endif

		if (!ptr)
			throw runtime_error(string("Symbol '") + name + "' not found in '" + filename + "'.");
	}